

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

int canvas_showtext(_glist *x)

{
  t_symbol *ptVar1;
  t_symbol *ptVar2;
  bool bVar3;
  int local_34;
  t_atom *local_30;
  int isarray;
  int argc;
  t_atom *argv;
  _glist *x_local;
  
  if ((x->gl_obj).te_binbuf == (_binbuf *)0x0) {
    local_30 = (t_atom *)0x0;
  }
  else {
    local_30 = binbuf_getvec((x->gl_obj).te_binbuf);
  }
  if ((x->gl_obj).te_binbuf == (_binbuf *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = binbuf_getnatom((x->gl_obj).te_binbuf);
  }
  bVar3 = false;
  if ((local_34 != 0) && (bVar3 = false, local_30->a_type == A_SYMBOL)) {
    ptVar1 = (local_30->a_w).w_symbol;
    ptVar2 = gensym("graph");
    bVar3 = ptVar1 == ptVar2;
  }
  if ((*(ushort *)&x->field_0xe8 >> 9 & 1) == 0) {
    x_local._4_4_ = (uint)((bVar3 ^ 0xffU) & 1);
  }
  else {
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

int canvas_showtext(const t_canvas *x)
{
    t_atom *argv = (x->gl_obj.te_binbuf? binbuf_getvec(x->gl_obj.te_binbuf):0);
    int argc = (x->gl_obj.te_binbuf? binbuf_getnatom(x->gl_obj.te_binbuf) : 0);
    int isarray = (argc && argv[0].a_type == A_SYMBOL &&
        argv[0].a_w.w_symbol == gensym("graph"));
    if(x->gl_hidetext)
      return 0;
    else
      return (!isarray);
}